

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

void TasOptimization::makeNesterovTestFunction
               (double L,int k,ObjectiveFunctionSingle *func,GradientFunctionSingle *grad,
               vector<double,_std::allocator<double>_> *minimum)

{
  reference pvVar1;
  double dVar2;
  int local_70;
  int local_6c;
  int i;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_58;
  anon_class_16_2_94731b88 local_50;
  anon_class_16_2_94731b88 local_40;
  vector<double,_std::allocator<double>_> *local_30;
  vector<double,_std::allocator<double>_> *minimum_local;
  GradientFunctionSingle *grad_local;
  ObjectiveFunctionSingle *func_local;
  double dStack_10;
  int k_local;
  double L_local;
  
  local_40.L = L;
  local_40.k = k;
  local_30 = minimum;
  minimum_local = (vector<double,_std::allocator<double>_> *)grad;
  grad_local = (GradientFunctionSingle *)func;
  func_local._4_4_ = k;
  dStack_10 = L;
  std::function<double(std::vector<double,std::allocator<double>>const&)>::operator=
            ((function<double(std::vector<double,std::allocator<double>>const&)> *)func,&local_40);
  local_50.L = dStack_10;
  local_50.k = func_local._4_4_;
  std::
  function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
  ::operator=((function<void(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>&)>
               *)minimum_local,&local_50);
  local_60._M_current = (double *)std::vector<double,_std::allocator<double>_>::begin(local_30);
  local_58 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator+(&local_60,(long)func_local._4_4_);
  _i = std::vector<double,_std::allocator<double>_>::end(local_30);
  local_6c = 0;
  std::fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,int>
            (local_58,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)_i
             ,&local_6c);
  for (local_70 = 0; local_70 < func_local._4_4_; local_70 = local_70 + 1) {
    dVar2 = (double)func_local._4_4_;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](local_30,(long)local_70);
    *pvVar1 = 1.0 - ((double)local_70 + 1.0) / (dVar2 + 1.0);
  }
  return;
}

Assistant:

void makeNesterovTestFunction(const double L, const int k, ObjectiveFunctionSingle &func, GradientFunctionSingle &grad,
                              std::vector<double> &minimum) {
    func = [=](const std::vector<double> &x)->double {
        double result = (L / 4.0) * ((1.0 / 2.0) * (x[0] * x[0] + x[k-1] * x[k-1]) - x[0]);
        double delta;
        for (int i=0; i<k-1; i++) {
            delta = x[i] - x[i+1];
            result += (L / 8.0) * (delta * delta);
        }
        return result;
    };
    grad = [=](const std::vector<double> &x, std::vector<double> &gx)->void {
        std::fill(gx.begin(), gx.end(), 0);
        gx[0] = (L / 4.0) * (x[0] - 1.0);
        gx[k-1] = (L / 4.0) * x[k-1];
        for (int i=0; i<k-1; i++) {
            gx[i] += (L / 4.0) * (x[i] - x[i+1]);
            gx[i+1] -= (L / 4.0) * (x[i] - x[i+1]);
        }
    };
    std::fill(minimum.begin() + k, minimum.end(), 0);
    for (int i=0; i<k; i++) {
        minimum[i] = 1.0 - ((double) i + 1.0) / (k + 1.0);
    }
}